

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O2

void av1_fwd_txfm2d_64x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int txfm1d_size;
  ulong uVar1;
  long lVar2;
  uint outstride;
  code *local_4090;
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [4096];
  
  av1_get_fwd_txfm_cfg(tx_type,'\x04',&cfg);
  txfm1d_size = tx_size_wide[cfg.tx_size];
  if (cfg.txfm_type_col == '\x03') {
    local_4090 = fdct32_sse4_1;
  }
  else if (cfg.txfm_type_col == '\v') {
    local_4090 = idtx32x32_sse4_1;
  }
  else if (cfg.txfm_type_col == '\x04') {
    local_4090 = fdct64_new_sse4_1;
  }
  else {
    local_4090 = (code *)0x0;
  }
  int16_array_with_stride_to_int32_array_without_stride(input,stride,output,txfm1d_size);
  (*local_4090)(output,(__m128i *)txfm_buf,(int)cfg.cos_bit_col,cfg.stage_range_col);
  av1_round_shift_array_32_sse4_1
            ((__m128i *)txfm_buf,(__m128i *)output,(uint)(txfm1d_size * txfm1d_size) >> 2,
             -(int)cfg.shift[1]);
  transpose_32(txfm1d_size,(__m128i *)output,(__m128i *)txfm_buf);
  outstride = txfm1d_size / 4 >> 1;
  lVar2 = 0;
  uVar1 = 0;
  if (0 < (int)outstride) {
    uVar1 = (ulong)outstride;
  }
  for (; uVar1 * 0x10 != lVar2; lVar2 = lVar2 + 0x10) {
    av1_fdct64_sse4_1((__m128i *)((long)txfm_buf + lVar2),(__m128i *)((long)output + lVar2),
                      cfg.cos_bit_row,txfm1d_size / 4,outstride);
  }
  av1_round_shift_array_32_sse4_1
            ((__m128i *)output,(__m128i *)output,outstride * (txfm1d_size >> 1),-(int)cfg.shift[2]);
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_sse4_1(const int16_t *input, int32_t *output,
                                 int stride, TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(16, int32_t, txfm_buf[4096]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X64, &cfg);
  (void)bd;
  fwd_txfm2d_64x64_sse4_1(input, output, stride, &cfg, txfm_buf);
}